

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O3

void validation_chainstatemanager_tests::chainstatemanager_rebalance_caches_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestOpts opts;
  unit_test_log_t *puVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  chainstatemanager_rebalance_caches t;
  undefined8 in_stack_fffffffffffff8c8;
  undefined8 in_stack_fffffffffffff8d0;
  pointer in_stack_fffffffffffff8d8;
  undefined8 in_stack_fffffffffffff8e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 local_698 [112];
  ios_base local_628 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  undefined1 local_500 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388 [24];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_80;
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_6a0 = "";
  memset((ostringstream *)local_500,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
  local_388[0]._M_string_length = 0;
  local_388[0].field_2._M_local_buf[0] = '\0';
  local_698[0] = 0x22;
  local_388[0]._M_dataplus._M_p = (pointer)&local_388[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_500,local_698,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_500,"chainstatemanager_rebalance_caches",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_500,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_388,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_698);
  if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
    operator_delete((void *)local_698._0_8_,local_698._16_8_ + 1);
  }
  local_6b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388[0]._M_dataplus._M_p;
  local_6b0 = local_388[0]._M_dataplus._M_p + local_388[0]._M_string_length;
  file.m_end = (iterator)0x70;
  file.m_begin = (iterator)&local_6a8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_6b8,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388[0]._M_dataplus._M_p != &local_388[0].field_2) {
    operator_delete(local_388[0]._M_dataplus._M_p,
                    CONCAT71(local_388[0].field_2._M_allocated_capacity._1_7_,
                             local_388[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
  std::ios_base::~ios_base((ios_base *)(local_500 + 0x70));
  local_698._0_8_ = (pointer)0x0;
  local_698._8_8_ = 0;
  local_698._16_8_ = 0;
  local_698._24_4_ = 0x1010101;
  local_698[0x1c] = '\0';
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8d0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8c8;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8d8;
  opts.coins_db_in_memory = (bool)(char)in_stack_fffffffffffff8e0;
  opts.block_tree_db_in_memory = (bool)(char)((ulong)in_stack_fffffffffffff8e0 >> 8);
  opts.setup_net = (bool)(char)((ulong)in_stack_fffffffffffff8e0 >> 0x10);
  opts.setup_validation_interface = (bool)(char)((ulong)in_stack_fffffffffffff8e0 >> 0x18);
  opts.min_validation_cache = (bool)(char)((ulong)in_stack_fffffffffffff8e0 >> 0x20);
  opts._29_3_ = (int3)((ulong)in_stack_fffffffffffff8e0 >> 0x28);
  TestChain100Setup::TestChain100Setup((TestChain100Setup *)local_500,REGTEST,opts);
  if ((pointer)local_698._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_698._0_8_,local_698._16_8_ - local_698._0_8_);
  }
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_6c0 = "";
  memset((ostringstream *)local_698,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_698);
  paVar1 = &local_520.field_2;
  local_520._M_string_length = 0;
  local_520.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_520._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_698,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_698,"chainstatemanager_rebalance_caches",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_698,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_520,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p;
  local_6d0 = local_520._M_dataplus._M_p + local_520._M_string_length;
  file_00.m_end = (iterator)0x70;
  file_00.m_begin = (iterator)&local_6c8;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_6d8,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar1) {
    operator_delete(local_520._M_dataplus._M_p,
                    CONCAT71(local_520.field_2._M_allocated_capacity._1_7_,
                             local_520.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_698);
  std::ios_base::~ios_base(local_628);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_6e0 = "";
  memset((ostringstream *)local_698,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_698);
  local_520._M_string_length = 0;
  local_520.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_520._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_698,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_698,"chainstatemanager_rebalance_caches",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_698,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_520,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p;
  local_6f0 = local_520._M_dataplus._M_p + local_520._M_string_length;
  file_01.m_end = (iterator)0x70;
  file_01.m_begin = (iterator)&local_6e8;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_6f8,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar1) {
    operator_delete(local_520._M_dataplus._M_p,
                    CONCAT71(local_520.field_2._M_allocated_capacity._1_7_,
                             local_520.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_698);
  std::ios_base::~ios_base(local_628);
  chainstatemanager_rebalance_caches::test_method((chainstatemanager_rebalance_caches *)local_500);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_700 = "";
  memset((ostringstream *)local_698,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_698);
  local_520._M_string_length = 0;
  local_520.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_520._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_698,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_698,"chainstatemanager_rebalance_caches",0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_698,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_520,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_718 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p;
  local_710 = local_520._M_dataplus._M_p + local_520._M_string_length;
  file_02.m_end = (iterator)0x70;
  file_02.m_begin = (iterator)&local_708;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_718,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar1) {
    operator_delete(local_520._M_dataplus._M_p,
                    CONCAT71(local_520.field_2._M_allocated_capacity._1_7_,
                             local_520.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_698);
  std::ios_base::~ios_base(local_628);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  memset((ostringstream *)local_698,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_698);
  local_520._M_string_length = 0;
  local_520.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_520._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_698,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_698,"chainstatemanager_rebalance_caches",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_698,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_520,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  file_03.m_end = (iterator)0x70;
  file_03.m_begin = &stack0xfffffffffffff8d8;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (puVar3,file_03,(size_t)&stack0xfffffffffffff8c8,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar1) {
    operator_delete(local_520._M_dataplus._M_p,
                    CONCAT71(local_520.field_2._M_allocated_capacity._1_7_,
                             local_520.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_698);
  std::ios_base::~ios_base(local_628);
  if (local_60._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_60,
               local_60._M_head_impl);
  }
  local_60._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_80);
  ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)local_500);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager_rebalance_caches, TestChain100Setup)
{
    ChainstateManager& manager = *m_node.chainman;

    size_t max_cache = 10000;
    manager.m_total_coinsdb_cache = max_cache;
    manager.m_total_coinstip_cache = max_cache;

    std::vector<Chainstate*> chainstates;

    // Create a legacy (IBD) chainstate.
    //
    Chainstate& c1 = manager.ActiveChainstate();
    chainstates.push_back(&c1);
    {
        LOCK(::cs_main);
        c1.InitCoinsCache(1 << 23);
        manager.MaybeRebalanceCaches();
    }

    BOOST_CHECK_EQUAL(c1.m_coinstip_cache_size_bytes, max_cache);
    BOOST_CHECK_EQUAL(c1.m_coinsdb_cache_size_bytes, max_cache);

    // Create a snapshot-based chainstate.
    //
    CBlockIndex* snapshot_base{WITH_LOCK(manager.GetMutex(), return manager.ActiveChain()[manager.ActiveChain().Height() / 2])};
    Chainstate& c2 = WITH_LOCK(cs_main, return manager.ActivateExistingSnapshot(*snapshot_base->phashBlock));
    chainstates.push_back(&c2);
    c2.InitCoinsDB(
        /*cache_size_bytes=*/1 << 23, /*in_memory=*/true, /*should_wipe=*/false);

    // Reset IBD state so IsInitialBlockDownload() returns true and causes
    // MaybeRebalancesCaches() to prioritize the snapshot chainstate, giving it
    // more cache space than the snapshot chainstate. Calling ResetIbd() is
    // necessary because m_cached_finished_ibd is already latched to true before
    // the test starts due to the test setup. After ResetIbd() is called.
    // IsInitialBlockDownload will return true because at this point the active
    // chainstate has a null chain tip.
    static_cast<TestChainstateManager&>(manager).ResetIbd();

    {
        LOCK(::cs_main);
        c2.InitCoinsCache(1 << 23);
        manager.MaybeRebalanceCaches();
    }

    BOOST_CHECK_CLOSE(double(c1.m_coinstip_cache_size_bytes), max_cache * 0.05, 1);
    BOOST_CHECK_CLOSE(double(c1.m_coinsdb_cache_size_bytes), max_cache * 0.05, 1);
    BOOST_CHECK_CLOSE(double(c2.m_coinstip_cache_size_bytes), max_cache * 0.95, 1);
    BOOST_CHECK_CLOSE(double(c2.m_coinsdb_cache_size_bytes), max_cache * 0.95, 1);
}